

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O0

bool __thiscall
MemTable::_put(MemTable *this,NodePosi pred_node,longlong key,string *value,bool delete_flag)

{
  bool bVar1;
  int iVar2;
  result_type_conflict rVar3;
  pointer pQVar4;
  NodePosi node;
  size_t sVar5;
  _Self *__x;
  NodePosi *ppQVar6;
  bool local_149;
  SSTableDataEntry local_118;
  reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_> local_d8;
  QuadList<SSTableDataEntry> local_d0;
  _Self local_b0;
  _List_iterator<QuadList<SSTableDataEntry>_> local_a8;
  reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_> local_a0;
  SSTableDataEntry local_98;
  NodePosi local_58;
  NodePosi new_node;
  time_t timestamp;
  undefined1 local_38 [8];
  reverse_iterator curr_level;
  bool delete_flag_local;
  string *value_local;
  longlong key_local;
  NodePosi pred_node_local;
  MemTable *this_local;
  
  curr_level.current._M_node._7_1_ = delete_flag;
  std::__cxx11::list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::
  rbegin((list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_> *)local_38)
  ;
  if ((_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::seed == '\0') &&
     (iVar2 = __cxa_guard_acquire(&_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)
                                   ::seed), iVar2 != 0)) {
    _put::seed = time((time_t *)0x0);
    __cxa_guard_release(&_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::
                         seed);
  }
  if ((_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::gen == '\0') &&
     (iVar2 = __cxa_guard_acquire(&_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)
                                   ::gen), iVar2 != 0)) {
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::mersenne_twister_engine(&_put::gen,_put::seed);
    __cxa_guard_release(&_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::
                         gen);
  }
  if ((_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::rand == '\0') &&
     (iVar2 = __cxa_guard_acquire(&_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)
                                   ::rand), iVar2 != 0)) {
    std::uniform_int_distribution<int>::uniform_int_distribution(&_put::rand,0,1);
    __cxa_guard_release(&_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::
                         rand);
  }
  new_node = (NodePosi)time((time_t *)0x0);
  pQVar4 = std::reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_>::operator->
                     ((reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_> *)
                      local_38);
  SSTableDataEntry::SSTableDataEntry
            (&local_98,(bool)(curr_level.current._M_node._7_1_ & 1),(time_t)new_node,key,value);
  node = QuadList<SSTableDataEntry>::insertAfterAbove(pQVar4,&local_98,pred_node,(NodePosi)0x0);
  SSTableDataEntry::~SSTableDataEntry(&local_98);
  local_58 = node;
  sVar5 = size_of_node(node);
  this->_size_bytes = sVar5 + this->_size_bytes;
  key_local = (longlong)pred_node;
  while (rVar3 = std::uniform_int_distribution<int>::operator()(&_put::rand,&_put::gen), rVar3 != 0)
  {
    while( true ) {
      local_149 = false;
      if (*(long *)(key_local + 0x50) == 0) {
        pQVar4 = std::reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_>::
                 operator->((reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_> *)
                            local_38);
        local_149 = QuadList<SSTableDataEntry>::valid(pQVar4,(NodePosi)key_local);
      }
      if (local_149 == false) break;
      key_local = *(longlong *)(key_local + 0x40);
    }
    if (*(long *)(key_local + 0x50) == 0) {
      local_a8._M_node =
           (_List_node_base *)
           std::reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_>::base
                     ((reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_> *)
                      local_38);
      __x = std::_List_iterator<QuadList<SSTableDataEntry>_>::operator--(&local_a8);
      local_b0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::begin
                     (&this->qlist);
      bVar1 = std::operator==(__x,&local_b0);
      if (bVar1) {
        QuadList<SSTableDataEntry>::QuadList(&local_d0);
        std::__cxx11::list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
        ::push_front(&this->qlist,&local_d0);
        QuadList<SSTableDataEntry>::~QuadList(&local_d0);
      }
      std::reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_>::operator++
                (&local_d8,(int)local_38);
      pQVar4 = std::reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_>::operator->
                         ((reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_> *)
                          local_38);
      ppQVar6 = QuadList<SSTableDataEntry>::first(pQVar4);
      key_local = (longlong)*ppQVar6;
    }
    else {
      key_local = *(longlong *)(key_local + 0x50);
      std::reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_>::operator++
                (&local_a0,(int)local_38);
    }
    pQVar4 = std::reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_>::operator->
                       ((reverse_iterator<std::_List_iterator<QuadList<SSTableDataEntry>_>_> *)
                        local_38);
    SSTableDataEntry::SSTableDataEntry
              (&local_118,(bool)(curr_level.current._M_node._7_1_ & 1),0,key,"");
    local_58 = QuadList<SSTableDataEntry>::insertAfterAbove
                         (pQVar4,&local_118,(NodePosi)key_local,local_58);
    SSTableDataEntry::~SSTableDataEntry(&local_118);
  }
  this->_size = this->_size + 1;
  return true;
}

Assistant:

bool MemTable::_put(NodePosi pred_node, long long key, std::string value, bool delete_flag) {
    auto curr_level = qlist.rbegin(); // If skipSearch didn't find k, it must return a appropriate position
    // at the bottom of qlist for insert a new tower of k
    static auto seed = time(nullptr);
    static auto gen = std::mt19937_64{static_cast<unsigned long long> (seed)};
    static auto rand = std::uniform_int_distribution<>{0, 1};
    auto timestamp = time(nullptr);
    auto new_node = curr_level->insertAfterAbove(MemTableEntry{delete_flag, timestamp, key, std::move(value)},
                                                 pred_node);
    _size_bytes += size_of_node(new_node);
    while (rand(gen)) {
        while (!pred_node->above && curr_level->valid(pred_node))
            pred_node = pred_node->pred;
        if (pred_node->above) {
            // Find a node of a tower.
            pred_node = pred_node->above;
            curr_level++;
        } else {
            // Unable to find a tower higher than curr_level.
            if (--(curr_level.base()) == qlist.begin()) {
                // If the tower should grow though top of SkipList arrived, add a level as top
                qlist.push_front(MemTableLevel{});
            }
            curr_level++;
            pred_node = curr_level->first();
        }
        // Do not repeat data on upper node to save memory, because skipSearch always turn to bottom if hit.
        new_node = curr_level->insertAfterAbove(MemTableEntry{delete_flag, 0, key, ""}, pred_node, new_node);
    }
    _size++;
    return true;
}